

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.h
# Opt level: O2

void __thiscall
icu_63::StringTrieBuilder::LinearMatchNode::LinearMatchNode
          (LinearMatchNode *this,int32_t len,Node *nextNode)

{
  int iVar1;
  
  if (nextNode == (Node *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = nextNode->hash;
  }
  (this->super_ValueNode).super_Node.hash = iVar1 + len * 0x25 + 0x11cccbbb;
  (this->super_ValueNode).super_Node.offset = 0;
  (this->super_ValueNode).hasValue = '\0';
  (this->super_ValueNode).value = 0;
  (this->super_ValueNode).super_Node.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UObject_003b48d0;
  this->length = len;
  this->next = nextNode;
  return;
}

Assistant:

static inline int32_t hashCode(const Node *node) { return node==NULL ? 0 : node->hashCode(); }